

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O2

void __thiscall f8n::debug::ConsoleBackend::verbose(ConsoleBackend *this,string *tag,string *string)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"verbose",&local_39);
  writeTo((ostream *)&std::cout,&local_38,tag,string);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void debug::ConsoleBackend::verbose(const std::string& tag, const std::string& string) {
        writeTo(std::cout, "verbose", tag, string);
    }